

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtls_record.cc
# Opt level: O0

void __thiscall bssl::DTLSReplayBitmap::Record(DTLSReplayBitmap *this,uint64_t seq_num)

{
  ulong local_30;
  uint64_t idx;
  uint64_t shift;
  size_t kWindowSize;
  uint64_t seq_num_local;
  DTLSReplayBitmap *this_local;
  
  kWindowSize = seq_num;
  seq_num_local = (uint64_t)this;
  shift = std::bitset<256UL>::size(&this->map_);
  if (this->max_seq_num_ < kWindowSize) {
    idx = kWindowSize - this->max_seq_num_;
    if (idx < shift) {
      std::bitset<256UL>::operator<<=(&this->map_,idx);
    }
    else {
      std::bitset<256UL>::reset(&this->map_);
    }
    this->max_seq_num_ = kWindowSize;
  }
  local_30 = this->max_seq_num_ - kWindowSize;
  if (local_30 < shift) {
    std::bitset<256UL>::operator[]((bitset<256UL> *)&stack0xffffffffffffffc0,(size_t)this);
    std::bitset<256UL>::reference::operator=((reference *)&stack0xffffffffffffffc0,true);
    std::bitset<256UL>::reference::~reference((reference *)&stack0xffffffffffffffc0);
  }
  return;
}

Assistant:

void DTLSReplayBitmap::Record(uint64_t seq_num) {
  const size_t kWindowSize = map_.size();

  // Shift the window if necessary.
  if (seq_num > max_seq_num_) {
    uint64_t shift = seq_num - max_seq_num_;
    if (shift >= kWindowSize) {
      map_.reset();
    } else {
      map_ <<= shift;
    }
    max_seq_num_ = seq_num;
  }

  uint64_t idx = max_seq_num_ - seq_num;
  if (idx < kWindowSize) {
    map_[idx] = true;
  }
}